

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void assign(gen_ctx_t gen_ctx)

{
  bitmap_t nb;
  void **ppvVar1;
  ra_ctx *prVar2;
  VARR_reg_info_t *pVVar3;
  VARR_MIR_reg_t *pVVar4;
  VARR_allocno_info_t *pVVar5;
  allocno_info_t *paVar6;
  VARR_bitmap_t *pVVar7;
  gen_ctx *pgVar8;
  gen_ctx *pgVar9;
  VARR_bitmap_t *pVVar10;
  VARR_live_range_t *pVVar11;
  VARR_lr_gap_t *pVVar12;
  lr_gap_t *plVar13;
  FILE *pFVar14;
  MIR_item_t_conflict pMVar15;
  bitmap_t bm;
  bool bVar16;
  byte bVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  MIR_type_t MVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  char *pcVar26;
  ulong uVar27;
  MIR_reg_t *pMVar28;
  char *pcVar29;
  ulong uVar30;
  allocno_info_t *paVar31;
  bitmap_el_t *pbVar32;
  bitmap_t *ppVVar33;
  FILE *pFVar34;
  live_range_t_conflict plVar35;
  lr_gap_t *plVar36;
  bitmap_t pVVar37;
  short sVar38;
  uint uVar39;
  gen_ctx_t pgVar40;
  gen_ctx_t pgVar41;
  MIR_item_t pMVar42;
  uint uVar43;
  MIR_reg_t reg;
  uint uVar44;
  gen_ctx_t pgVar45;
  gen_ctx_t pgVar46;
  gen_ctx_t in_R8;
  char cVar47;
  uint uVar48;
  lr_bb_t_conflict plVar49;
  long lVar50;
  gen_ctx_t pgVar51;
  ulong uVar52;
  uint uVar53;
  size_t sVar54;
  bool bVar55;
  lr_gap_t el;
  lr_gap_t el_00;
  lr_gap_t el_01;
  lr_gap_t el_02;
  ulong in_stack_fffffffffffffec8;
  undefined1 local_128 [56];
  gen_ctx_t local_f0;
  gen_ctx_t local_e8;
  uint local_e0;
  int local_dc;
  MIR_func_t local_d8;
  gen_ctx_t local_d0;
  bitmap_t local_c8;
  gen_ctx_t local_c0;
  int local_b8;
  MIR_reg_t local_b4;
  gen_ctx_t local_b0;
  bitmap_t local_a8;
  bitmap_t local_a0;
  gen_ctx_t local_98;
  bitmap_t local_90;
  bitmap_t local_88;
  bitmap_t local_80;
  undefined1 local_78 [16];
  MIR_item_t local_68;
  FILE *local_60;
  gen_ctx_t local_58;
  uint local_48;
  
  pgVar46 = (gen_ctx_t)gen_ctx->ctx;
  uVar44 = gen_ctx->curr_cfg->max_var;
  local_d8 = (gen_ctx->curr_func_item->u).func;
  local_58 = pgVar46;
  pcVar26 = (char *)_MIR_get_module_global_var_hard_regs
                              ((MIR_context_t)pgVar46,gen_ctx->curr_func_item->module);
  local_128._36_4_ = gen_ctx->optimize_level;
  prVar2 = gen_ctx->ra_ctx;
  pgVar45 = (gen_ctx_t)prVar2->conflict_locs1;
  local_90 = gen_ctx->temp_bitmap2;
  gen_ctx->func_stack_slots_num = 0;
  pVVar3 = gen_ctx->curr_cfg->reg_info;
  if (pVVar3 == (VARR_reg_info_t *)0x0) goto LAB_0016eeac;
  prVar2->curr_reg_infos = pVVar3->varr;
  pVVar4 = prVar2->reg_renumber;
  local_128._48_8_ = pcVar26;
  local_98 = pgVar45;
  if ((pVVar4 == (VARR_MIR_reg_t *)0x0) || (pVVar4->varr == (MIR_reg_t *)0x0)) {
LAB_0016ee84:
    assign_cold_65();
  }
  else {
    pVVar4->els_num = 0;
    uVar43 = 0;
    do {
      pVVar4 = gen_ctx->ra_ctx->reg_renumber;
      pgVar46 = (gen_ctx_t)pVVar4->varr;
      if (pgVar46 == (gen_ctx_t)0x0) goto LAB_0016ed9f;
      uVar27 = pVVar4->els_num + 1;
      if (pVVar4->size < uVar27) {
        sVar54 = (uVar27 >> 1) + uVar27;
        pcVar26 = (char *)(sVar54 * 4);
        pMVar28 = (MIR_reg_t *)realloc(pgVar46,(size_t)pcVar26);
        pVVar4->varr = pMVar28;
        pVVar4->size = sVar54;
      }
      sVar54 = pVVar4->els_num;
      pVVar4->els_num = sVar54 + 1;
      pVVar4->varr[sVar54] = 0xffffffff;
      uVar43 = uVar43 + 1;
    } while (uVar43 <= uVar44);
    prVar2 = gen_ctx->ra_ctx;
    pVVar5 = prVar2->sorted_regs;
    if ((pVVar5 != (VARR_allocno_info_t *)0x0) && (pVVar5->varr != (allocno_info_t *)0x0)) {
      pVVar5->els_num = 0;
      local_a0 = (bitmap_t)prVar2->curr_reg_infos;
      prVar2->start_mem_loc = 0x22;
      uVar43 = local_128._0_4_;
      if (0x21 < uVar44) {
        uVar53 = 0x22;
        do {
          pVVar37 = gen_ctx->tied_regs;
          if (pVVar37 == (bitmap_t)0x0) goto LAB_0016edb3;
          uVar27 = (ulong)uVar53;
          if (uVar27 < pVVar37->els_num << 6) {
            uVar52 = (pVVar37->varr[uVar53 >> 6] >> (uVar27 & 0x3f) & 1) << 0x20;
          }
          else {
            uVar52 = 0;
          }
          pVVar37 = gen_ctx->addr_regs;
          if (pVVar37 == (bitmap_t)0x0) goto LAB_0016edbf;
          if ((uVar27 < pVVar37->els_num << 6) &&
             ((pVVar37->varr[uVar53 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) {
            pgVar46 = (gen_ctx_t)gen_ctx->ctx;
            local_128._16_4_ = uVar53 - 0x21;
            MVar22 = MIR_reg_type((MIR_context_t)pgVar46,uVar53 - 0x21,local_d8);
            pcVar26 = (char *)gen_ctx->func_stack_slots_num;
            uVar23 = 0;
            uVar39 = 1;
            do {
              in_R8 = (gen_ctx_t)CONCAT71((int7)((ulong)in_R8 >> 8),MVar22 == MIR_T_LD);
              uVar48 = (uint)pcVar26 + 0x22;
              bVar55 = uVar23 != 0;
              uVar43 = ((uint)pcVar26 < 0xffffffde && MVar22 == MIR_T_LD) + 1;
              if (bVar55) {
                uVar48 = (uint)pgVar46;
                uVar43 = uVar39;
              }
              uVar23 = 2;
              if (!bVar55) {
                uVar23 = (uint)((uVar48 - 0x22) % uVar43 == 0);
              }
              pcVar26 = (char *)((long)&((gen_ctx_t)pcVar26)->ctx + 1);
              pgVar46 = (gen_ctx_t)(ulong)uVar48;
              uVar39 = uVar43;
            } while (uVar23 < uVar43);
            gen_ctx->func_stack_slots_num = (size_t)pcVar26;
            prVar2 = gen_ctx->ra_ctx;
            pVVar4 = prVar2->reg_renumber;
            if (((pVVar4 == (VARR_MIR_reg_t *)0x0) || (pVVar4->varr == (MIR_reg_t *)0x0)) ||
               (pVVar4->els_num <= uVar27)) goto LAB_0016edd0;
            pVVar4->varr[uVar27] = uVar48;
            prVar2->start_mem_loc = uVar43 + uVar48;
            pgVar45 = (gen_ctx_t)gen_ctx->debug_file;
            if ((pgVar45 != (gen_ctx_t)0x0) && (1 < gen_ctx->debug_level)) {
              pcVar29 = MIR_reg_name(gen_ctx->ctx,local_128._16_4_,local_d8);
              in_R8 = (gen_ctx_t)gen_ctx->ra_ctx->curr_reg_infos[uVar27].freq;
              pcVar26 = " Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n";
              fprintf((FILE *)pgVar45," Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",
                      pcVar29,uVar27,in_R8,(ulong)uVar48);
              pgVar46 = pgVar45;
            }
          }
          else {
            pVVar5 = gen_ctx->ra_ctx->sorted_regs;
            pgVar46 = (gen_ctx_t)pVVar5->varr;
            if (pgVar46 == (gen_ctx_t)0x0) goto LAB_0016eddc;
            uVar30 = pVVar5->els_num + 1;
            if (pVVar5->size < uVar30) {
              sVar54 = (uVar30 >> 1) + uVar30;
              pcVar26 = (char *)(sVar54 * 0x10);
              paVar31 = (allocno_info_t *)realloc(pgVar46,(size_t)pcVar26);
              pVVar5->varr = paVar31;
              pVVar5->size = sVar54;
            }
            sVar54 = pVVar5->els_num;
            paVar6 = pVVar5->varr;
            pVVar5->els_num = sVar54 + 1;
            paVar31 = paVar6 + sVar54;
            paVar31->reg = (int)(uVar52 | uVar27);
            paVar31->tied_reg_p = (int)((uVar52 | uVar27) >> 0x20);
            paVar6[sVar54].reg_infos = (reg_info_t *)local_a0;
            pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar27))
            goto LAB_0016ed93;
            sVar54 = 0;
            for (plVar35 = pVVar11->varr[uVar27]; plVar35 != (live_range_t_conflict)0x0;
                plVar35 = plVar35->next) {
              sVar54 = sVar54 + (long)((plVar35->finish - plVar35->start) + 1);
            }
            gen_ctx->ra_ctx->curr_reg_infos[uVar27].live_length = sVar54;
          }
          uVar53 = uVar53 + 1;
        } while (uVar53 <= uVar44);
      }
      pgVar45 = (gen_ctx_t)local_128._48_8_;
      local_128._0_4_ = uVar43;
      if (-1 < gen_ctx->lr_ctx->curr_point) {
        uVar27 = 0;
        do {
          prVar2 = gen_ctx->ra_ctx;
          pVVar7 = prVar2->used_locs;
          if (pVVar7 == (VARR_bitmap_t *)0x0) goto LAB_0016edfc;
          uVar52 = pVVar7->els_num;
          pcVar26 = (char *)(long)(int)uVar52;
          if ((long)pcVar26 <= (long)uVar27) break;
          ppVVar33 = pVVar7->varr;
          bVar55 = ppVVar33 != (bitmap_t *)0x0;
          pcVar26 = (char *)CONCAT71((int7)(int3)(uVar52 >> 8),bVar55);
          if (pgVar45 == (gen_ctx_t)0x0) {
            if (uVar52 <= uVar27 || !bVar55) goto LAB_0016ee51;
            pVVar37 = ppVVar33[uVar27];
            if ((pVVar37 == (bitmap_t)0x0) || (pVVar37->varr == (bitmap_el_t *)0x0))
            goto LAB_0016ee10;
            pVVar37->els_num = 0;
            if (1 < (uint)local_128._36_4_) {
              pVVar7 = prVar2->busy_used_locs;
              if (((pVVar7 != (VARR_bitmap_t *)0x0) && (pVVar7->varr != (bitmap_t *)0x0)) &&
                 (uVar27 < pVVar7->els_num)) {
                pVVar37 = pVVar7->varr[uVar27];
                if ((pVVar37 != (bitmap_t)0x0) && (pVVar37->varr != (bitmap_el_t *)0x0)) {
                  pVVar37->els_num = 0;
                  goto LAB_0016d78f;
                }
                goto LAB_0016ee4c;
              }
              goto LAB_0016ee29;
            }
          }
          else {
            if (uVar52 <= uVar27 || !bVar55) goto LAB_0016ee24;
            pVVar37 = ppVVar33[uVar27];
            if (pVVar37 == (bitmap_t)0x0) goto LAB_0016ee1f;
            pgVar8 = (gen_ctx *)pVVar37->els_num;
            pgVar9 = (gen_ctx *)pgVar45->ctx;
            if (pgVar9 <= pgVar8) {
              if (pVVar37->varr != (bitmap_el_t *)0x0) {
                pVVar37->els_num = (size_t)pgVar9;
                goto LAB_0016d695;
              }
              assign_cold_7();
LAB_0016ee7a:
              assign_cold_10();
LAB_0016ee7f:
              assign_cold_38();
              goto LAB_0016ee84;
            }
            lVar50 = (long)((ulong)pgVar9 & 0x3ffffffffffffff) - (long)pgVar8;
            if (pgVar8 <= (gen_ctx *)((ulong)pgVar9 & 0x3ffffffffffffff) && lVar50 != 0) {
              do {
                if (pVVar37->varr == (bitmap_el_t *)0x0) goto LAB_0016ed70;
                uVar52 = pVVar37->els_num + 1;
                if (pVVar37->size < uVar52) {
                  sVar54 = (uVar52 >> 1) + uVar52;
                  pbVar32 = (bitmap_el_t *)realloc(pVVar37->varr,sVar54 * 8);
                  pVVar37->varr = pbVar32;
                  pVVar37->size = sVar54;
                  pgVar45 = (gen_ctx_t)local_128._48_8_;
                }
                sVar54 = pVVar37->els_num;
                pVVar37->els_num = sVar54 + 1;
                pVVar37->varr[sVar54] = 0;
                lVar50 = lVar50 + -1;
              } while (lVar50 != 0);
            }
LAB_0016d695:
            pgVar46 = (gen_ctx_t)pVVar37->varr;
            pcVar26 = (char *)pgVar45->curr_func_item;
            memcpy(pgVar46,pcVar26,(long)pgVar9 << 3);
            if (1 < (uint)local_128._36_4_) {
              pVVar7 = gen_ctx->ra_ctx->busy_used_locs;
              if (((pVVar7 != (VARR_bitmap_t *)0x0) && (pVVar7->varr != (bitmap_t *)0x0)) &&
                 (uVar27 < pVVar7->els_num)) {
                pVVar37 = pVVar7->varr[uVar27];
                if (pVVar37 == (bitmap_t)0x0) goto LAB_0016ee7a;
                pgVar8 = (gen_ctx *)pVVar37->els_num;
                pgVar9 = (gen_ctx *)pgVar45->ctx;
                if (pgVar8 < pgVar9) {
                  lVar50 = (long)((ulong)pgVar9 & 0x3ffffffffffffff) - (long)pgVar8;
                  if (pgVar8 <= (gen_ctx *)((ulong)pgVar9 & 0x3ffffffffffffff) && lVar50 != 0) {
                    do {
                      if (pVVar37->varr == (bitmap_el_t *)0x0) goto LAB_0016eda4;
                      uVar52 = pVVar37->els_num + 1;
                      if (pVVar37->size < uVar52) {
                        sVar54 = (uVar52 >> 1) + uVar52;
                        pbVar32 = (bitmap_el_t *)realloc(pVVar37->varr,sVar54 * 8);
                        pVVar37->varr = pbVar32;
                        pVVar37->size = sVar54;
                        pgVar45 = (gen_ctx_t)local_128._48_8_;
                      }
                      sVar54 = pVVar37->els_num;
                      pVVar37->els_num = sVar54 + 1;
                      pVVar37->varr[sVar54] = 0;
                      lVar50 = lVar50 + -1;
                    } while (lVar50 != 0);
                  }
                }
                else {
                  if (pVVar37->varr == (bitmap_el_t *)0x0) goto LAB_0016ee9d;
                  pVVar37->els_num = (size_t)pgVar9;
                }
                pgVar46 = (gen_ctx_t)pVVar37->varr;
                pcVar26 = (char *)pgVar45->curr_func_item;
                memcpy(pgVar46,pcVar26,(long)pgVar9 << 3);
                goto LAB_0016d78f;
              }
              goto LAB_0016ee01;
            }
          }
LAB_0016d78f:
          bVar55 = (long)uVar27 < (long)gen_ctx->lr_ctx->curr_point;
          uVar27 = uVar27 + 1;
        } while (bVar55);
      }
LAB_0016d9e1:
      pVVar7 = gen_ctx->ra_ctx->used_locs;
      if (pVVar7 != (VARR_bitmap_t *)0x0) {
        if (gen_ctx->lr_ctx->curr_point < (int)pVVar7->els_num) {
          pVVar5 = gen_ctx->ra_ctx->sorted_regs;
          if (pVVar5 == (VARR_allocno_info_t *)0x0) goto LAB_0016eeb1;
          local_a8 = (bitmap_t)pVVar5->els_num;
          pgVar46 = (gen_ctx_t)pVVar5->varr;
          pcVar26 = (char *)(long)(int)local_a8;
          qsort(pgVar46,(size_t)pcVar26,0x10,allocno_info_compare_func);
          pVVar7 = gen_ctx->ra_ctx->used_locs;
          if (pVVar7 == (VARR_bitmap_t *)0x0) goto LAB_0016eeb6;
          pVVar10 = gen_ctx->ra_ctx->busy_used_locs;
          if (pVVar10 == (VARR_bitmap_t *)0x0) goto LAB_0016eebb;
          local_128._48_8_ = pVVar7->varr;
          local_a0 = (bitmap_t)pVVar10->varr;
          uVar27 = 0;
          goto LAB_0016da79;
        }
        pVVar37 = (bitmap_t)malloc(0x18);
        pVVar37->els_num = 0;
        pVVar37->size = 1;
        pbVar32 = (bitmap_el_t *)malloc(8);
        pVVar37->varr = pbVar32;
        if (pgVar45 != (gen_ctx_t)0x0) {
          pgVar8 = (gen_ctx *)pgVar45->ctx;
          if (pgVar8 == (gen_ctx *)0x0) {
            if (pbVar32 == (bitmap_el_t *)0x0) goto LAB_0016ee47;
            pVVar37->els_num = 0;
          }
          else {
            for (uVar27 = (ulong)pgVar8 & 0x3ffffffffffffff; uVar27 != 0; uVar27 = uVar27 - 1) {
              if (pVVar37->varr == (bitmap_el_t *)0x0) goto LAB_0016ed57;
              uVar52 = pVVar37->els_num + 1;
              if (pVVar37->size < uVar52) {
                sVar54 = (uVar52 >> 1) + uVar52;
                pbVar32 = (bitmap_el_t *)realloc(pVVar37->varr,sVar54 * 8);
                pVVar37->varr = pbVar32;
                pVVar37->size = sVar54;
              }
              sVar54 = pVVar37->els_num;
              pVVar37->els_num = sVar54 + 1;
              pVVar37->varr[sVar54] = 0;
            }
          }
          pcVar26 = (char *)pgVar45->curr_func_item;
          memcpy(pVVar37->varr,pcVar26,(long)pgVar8 << 3);
        }
        pVVar7 = gen_ctx->ra_ctx->used_locs;
        pgVar46 = (gen_ctx_t)pVVar7->varr;
        if (pgVar46 == (gen_ctx_t)0x0) goto LAB_0016edcb;
        uVar27 = pVVar7->els_num + 1;
        if (pVVar7->size < uVar27) {
          sVar54 = (uVar27 >> 1) + uVar27;
          pcVar26 = (char *)(sVar54 * 8);
          ppVVar33 = (bitmap_t *)realloc(pgVar46,(size_t)pcVar26);
          pVVar7->varr = ppVVar33;
          pVVar7->size = sVar54;
        }
        sVar54 = pVVar7->els_num;
        pVVar7->els_num = sVar54 + 1;
        pVVar7->varr[sVar54] = pVVar37;
        if (1 < (uint)local_128._36_4_) {
          pVVar37 = (bitmap_t)malloc(0x18);
          pVVar37->els_num = 0;
          pVVar37->size = 1;
          pgVar46 = (gen_ctx_t)0x8;
          pbVar32 = (bitmap_el_t *)malloc(8);
          pVVar37->varr = pbVar32;
          if (pgVar45 != (gen_ctx_t)0x0) {
            pgVar8 = (gen_ctx *)pgVar45->ctx;
            if (pgVar8 == (gen_ctx *)0x0) {
              if (pbVar32 == (bitmap_el_t *)0x0) goto LAB_0016ee93;
              pVVar37->els_num = 0;
            }
            else {
              for (uVar27 = (ulong)pgVar8 & 0x3ffffffffffffff; uVar27 != 0; uVar27 = uVar27 - 1) {
                if (pVVar37->varr == (bitmap_el_t *)0x0) goto LAB_0016ed61;
                uVar52 = pVVar37->els_num + 1;
                if (pVVar37->size < uVar52) {
                  sVar54 = (uVar52 >> 1) + uVar52;
                  pbVar32 = (bitmap_el_t *)realloc(pVVar37->varr,sVar54 * 8);
                  pVVar37->varr = pbVar32;
                  pVVar37->size = sVar54;
                }
                sVar54 = pVVar37->els_num;
                pVVar37->els_num = sVar54 + 1;
                pVVar37->varr[sVar54] = 0;
              }
            }
            pcVar26 = (char *)pgVar45->curr_func_item;
            memcpy(pVVar37->varr,pcVar26,(long)pgVar8 << 3);
          }
          pVVar7 = gen_ctx->ra_ctx->busy_used_locs;
          pgVar46 = (gen_ctx_t)pVVar7->varr;
          if (pgVar46 == (gen_ctx_t)0x0) goto LAB_0016ee0b;
          uVar27 = pVVar7->els_num + 1;
          if (pVVar7->size < uVar27) {
            sVar54 = (uVar27 >> 1) + uVar27;
            pcVar26 = (char *)(sVar54 * 8);
            ppVVar33 = (bitmap_t *)realloc(pgVar46,(size_t)pcVar26);
            pVVar7->varr = ppVVar33;
            pVVar7->size = sVar54;
          }
          sVar54 = pVVar7->els_num;
          pVVar7->els_num = sVar54 + 1;
          pVVar7->varr[sVar54] = pVVar37;
        }
        goto LAB_0016d9e1;
      }
      goto LAB_0016edae;
    }
  }
  assign_cold_63();
  goto LAB_0016ee8e;
LAB_0016ed57:
  assign_cold_19();
LAB_0016ed5c:
  assign_cold_58();
LAB_0016ed61:
  assign_cold_21();
LAB_0016ed66:
  assign_cold_56();
LAB_0016ed6b:
  assign_cold_55();
LAB_0016ed70:
  assign_cold_12();
LAB_0016ed75:
  assign_cold_49();
LAB_0016ed84:
  assign_cold_43();
LAB_0016ed93:
  assign_cold_2();
LAB_0016ed9f:
  assign_cold_64();
LAB_0016eda4:
  assign_cold_9();
LAB_0016eda9:
  assign_cold_54();
LAB_0016edae:
  assign_cold_62();
LAB_0016edb3:
  assign_cold_5();
LAB_0016edbf:
  assign_cold_4();
LAB_0016edcb:
  assign_cold_24();
LAB_0016edd0:
  assign_cold_1();
LAB_0016eddc:
  assign_cold_3();
LAB_0016ede8:
  assign_cold_34();
LAB_0016eded:
  assign_cold_28();
LAB_0016edf2:
  assign_cold_53();
LAB_0016edf7:
  assign_cold_29();
LAB_0016edfc:
  assign_cold_18();
LAB_0016ee01:
  assign_cold_11();
LAB_0016ee06:
  assign_cold_35();
LAB_0016ee0b:
  assign_cold_23();
LAB_0016ee10:
  assign_cold_17();
LAB_0016ee15:
  assign_cold_47();
LAB_0016ee1a:
  assign_cold_48();
LAB_0016ee1f:
  assign_cold_13();
LAB_0016ee24:
  assign_cold_6();
LAB_0016ee29:
  assign_cold_16();
LAB_0016ee2e:
  assign_cold_32();
LAB_0016ee33:
  assign_cold_36();
LAB_0016ee38:
  assign_cold_50();
LAB_0016ee3d:
  assign_cold_51();
LAB_0016ee42:
  assign_cold_52();
LAB_0016ee47:
  assign_cold_20();
LAB_0016ee4c:
  assign_cold_15();
LAB_0016ee51:
  assign_cold_14();
LAB_0016ee56:
  __assert_fail("hard_reg >= 0 && hard_reg <= ST1_HARD_REG && target_locs_num (hard_reg, type) == 1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1dac,"void assign(gen_ctx_t)");
  while( true ) {
    plVar35 = pVVar11->varr[uVar27];
    if (plVar35 != (live_range_t_conflict)0x0) {
      pgVar45 = (gen_ctx_t)(uVar27 + 1);
      uVar52 = 1L << (uVar27 & 0x3f);
      do {
        if (plVar35->start <= plVar35->finish) {
          lVar50 = (long)plVar35->start + -1;
          do {
            pgVar40 = (gen_ctx_t)((MIR_item_t_conflict *)(local_128._48_8_ + 0x68))[lVar50 + -0xc];
            pcVar26 = (char *)pgVar45;
            pgVar46 = pgVar40;
            bitmap_expand((bitmap_t)pgVar40,(size_t)pgVar45);
            if (pgVar40 == (gen_ctx_t)0x0) goto LAB_0016ecc9;
            pMVar42 = ((DLIST_LINK_MIR_item_t *)&pgVar40->curr_func_item)->prev;
            pMVar42->data = (void *)((ulong)pMVar42->data | uVar52);
            if (1 < (uint)local_128._36_4_) {
              pgVar40 = (gen_ctx_t)(&local_a0->size)[lVar50];
              pcVar26 = (char *)pgVar45;
              pgVar46 = pgVar40;
              bitmap_expand((bitmap_t)pgVar40,(size_t)pgVar45);
              if (pgVar40 == (gen_ctx_t)0x0) goto LAB_0016ecce;
              pMVar42 = ((DLIST_LINK_MIR_item_t *)&pgVar40->curr_func_item)->prev;
              pMVar42->data = (void *)((ulong)pMVar42->data | uVar52);
            }
            lVar50 = lVar50 + 1;
          } while (lVar50 < plVar35->finish);
        }
        plVar35 = plVar35->next;
      } while (plVar35 != (live_range_t)0x0);
    }
    uVar27 = uVar27 + 1;
    if (uVar27 == 0x22) break;
LAB_0016da79:
    pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
    if (((pVVar11 == (VARR_live_range_t *)0x0) || (pVVar11->varr == (live_range_t_conflict *)0x0))
       || (pVVar11->els_num <= uVar27)) goto LAB_0016ed5c;
  }
  pVVar37 = gen_ctx->func_used_hard_regs;
  if ((pVVar37 != (bitmap_t)0x0) && (pVVar37->varr != (bitmap_el_t *)0x0)) {
    pVVar37->els_num = 0;
    if (1 < (uint)local_128._36_4_) {
      HTAB_lr_gap_t_clear(gen_ctx->ra_ctx->lr_gap_tab);
    }
    if (0 < (int)(uint)local_a8) {
      local_a8 = (bitmap_t)(ulong)((uint)local_a8 & 0x7fffffff);
      pVVar37 = (bitmap_t)0x0;
      do {
        pVVar5 = gen_ctx->ra_ctx->sorted_regs;
        if (((pVVar5 == (VARR_allocno_info_t *)0x0) || (pVVar5->varr == (allocno_info_t *)0x0)) ||
           ((bitmap_t)pVVar5->els_num <= pVVar37)) goto LAB_0016ed66;
        pVVar4 = gen_ctx->ra_ctx->reg_renumber;
        if ((pVVar4 == (VARR_MIR_reg_t *)0x0) || (pVVar4->varr == (MIR_reg_t *)0x0))
        goto LAB_0016ed6b;
        local_d0 = *(gen_ctx_t *)(pVVar5->varr + (long)pVVar37);
        pFVar34 = (FILE *)((ulong)local_d0 & 0xffffffff);
        if ((FILE *)pVVar4->els_num <= pFVar34) goto LAB_0016ed6b;
        local_128._24_8_ = pFVar34;
        local_80 = pVVar37;
        if (pVVar4->varr[(long)pFVar34] == 0xffffffff) {
          pgVar46 = (gen_ctx_t)gen_ctx->ctx;
          reg = (int)local_d0 - 0x21;
          local_128._8_4_ = MIR_reg_type((MIR_context_t)pgVar46,reg,local_d8);
          pgVar40 = local_58;
          pgVar45 = local_98;
          uVar19 = local_128._48_8_;
          pVVar5 = gen_ctx->ra_ctx->sorted_regs;
          if (((pVVar5 == (VARR_allocno_info_t *)0x0) || (pVVar5->varr == (allocno_info_t *)0x0)) ||
             ((bitmap_t)pVVar5->els_num <= local_80)) goto LAB_0016eda9;
          if (pVVar5->varr[(long)pVVar37].tied_reg_p == 0) {
            pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) ||
               ((FILE *)pVVar11->els_num <= (ulong)local_128._24_8_)) goto LAB_0016edf2;
            pgVar40 = (gen_ctx_t)pVVar11->varr[local_128._24_8_];
            if (pgVar40 != (gen_ctx_t)0x0) {
              if ((local_98 == (gen_ctx_t)0x0) || (local_98->curr_func_item == (MIR_item_t)0x0))
              goto LAB_0016ee42;
              local_98->ctx = (MIR_context_t)0x0;
              local_b0 = pgVar40;
              do {
                if ((int)pgVar40->optimize_level <= *(int *)&pgVar40->field_0xc) {
                  lVar50 = (long)(int)pgVar40->optimize_level + -1;
                  do {
                    pgVar46 = pgVar45;
                    bitmap_ior((bitmap_t)pgVar45,(bitmap_t)pgVar45,
                               (bitmap_t)((MIR_item_t_conflict *)(uVar19 + 0x68))[lVar50 + -0xc]);
                    lVar50 = lVar50 + 1;
                  } while (lVar50 < *(int *)&pgVar40->field_0xc);
                }
                pgVar40 = (gen_ctx_t)pgVar40->debug_file;
              } while (pgVar40 != (gen_ctx_t)0x0);
              prVar2 = gen_ctx->ra_ctx;
              pVVar12 = prVar2->spill_gaps;
              if ((pVVar12 == (VARR_lr_gap_t *)0x0) || (pVVar12->varr == (lr_gap_t *)0x0))
              goto LAB_0016ee3d;
              pVVar12->els_num = 0;
              cVar47 = local_128._8_4_ == MIR_T_P || (uint)local_128._8_4_ < MIR_T_F;
              local_128._4_4_ = 0xffffffff;
              pgVar40 = (gen_ctx_t)0x0;
              pcVar26 = (char *)0x0;
              do {
                if (pgVar40 < (gen_ctx_t)((long)pgVar45->ctx << 6)) {
                  if (local_128._8_4_ != MIR_T_LD) {
                    pgVar46 = (gen_ctx_t)pgVar45->curr_func_item;
                    in_R8 = (gen_ctx_t)(1L << ((ulong)pgVar40 & 0x3f) & (ulong)pgVar46->ctx);
                    if (in_R8 == (gen_ctx_t)0x0) goto LAB_0016ddc2;
                  }
                }
                else if (local_128._8_4_ != MIR_T_LD) {
LAB_0016ddc2:
                  bVar55 = pgVar40 < (gen_ctx_t)&DAT_00000010 != (bool)cVar47;
                  pgVar46 = (gen_ctx_t)CONCAT71((int7)((ulong)pgVar46 >> 8),bVar55);
                  if (!bVar55) {
                    uVar44 = (uint)pgVar40;
                    pgVar46 = (gen_ctx_t)(ulong)(uVar44 & 0x3e);
                    if ((0x20 < (uVar44 & 0x3e)) ||
                       (in_R8 = (gen_ctx_t)&DAT_101000410, (0x101000410U >> (long)pgVar46 & 1) == 0)
                       ) {
                      if (local_128._4_4_ == 0xffffffff) {
LAB_0016de30:
                        pcVar26 = (char *)gen_ctx->call_used_hard_regs[0x12];
                        if ((gen_ctx_t)pcVar26 == (gen_ctx_t)0x0) goto LAB_0016ee98;
                        pgVar46 = (gen_ctx_t)((long)((gen_ctx_t)pcVar26)->ctx << 6);
                        local_128._4_4_ = uVar44;
                        if (pgVar40 < pgVar46) {
                          pcVar26 = (char *)(ulong)(~(uint)((ulong)((gen_ctx_t)pcVar26)->
                                                                   curr_func_item->data >>
                                                           ((ulong)pgVar40 & 0x3f)) & 1);
                        }
                        else {
                          pcVar26 = &DAT_00000001;
                        }
                      }
                      else if ((int)pcVar26 == 0) {
                        pcVar26 = (char *)0x0;
                      }
                      else {
                        pgVar46 = (gen_ctx_t)gen_ctx->call_used_hard_regs[0x12];
                        if (pgVar46 == (gen_ctx_t)0x0) goto LAB_0016eea2;
                        in_R8 = (gen_ctx_t)((long)pgVar46->ctx << 6);
                        pcVar26 = &DAT_00000001;
                        if ((pgVar40 < in_R8) &&
                           (pgVar46 = (gen_ctx_t)
                                      ((DLIST_LINK_MIR_item_t *)&pgVar46->curr_func_item)->prev->
                                      data, ((ulong)pgVar46 >> ((ulong)pgVar40 & 0x3f) & 1) != 0))
                        goto LAB_0016de30;
                      }
                    }
                  }
                }
                pgVar40 = (gen_ctx_t)((long)&pgVar40->ctx + 1);
              } while (pgVar40 != (gen_ctx_t)0x22);
              if (local_128._4_4_ == 0xffffffff) {
                if ((uint)local_128._36_4_ < 2) {
LAB_0016e5f0:
                  in_R8 = (gen_ctx_t)local_128;
                  local_128._4_4_ =
                       get_stack_loc(gen_ctx,gen_ctx->ra_ctx->start_mem_loc,local_128._8_4_,
                                     (bitmap_t)pgVar45,(int *)in_R8);
                  goto LAB_0016e611;
                }
                if (prVar2->used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016eec5;
                if (prVar2->busy_used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016eeca;
                local_128._16_8_ = prVar2->used_locs->varr;
                local_88 = (bitmap_t)prVar2->busy_used_locs->varr;
                local_60 = (FILE *)(ulong)(uint)(local_128._8_4_ << 0x10);
                local_68 = (MIR_item_t)(local_128._24_8_ << 0x20);
                pgVar40 = (gen_ctx_t)0x0;
                local_128._4_4_ = 0xffffffff;
                local_e0 = 0;
                local_dc = 0;
                local_b8 = 0;
                local_128[0xf] = cVar47;
                local_b4 = reg;
                do {
                  if (pgVar40 < (gen_ctx_t)&DAT_00000010 == (bool)cVar47 &&
                      local_128._8_4_ != MIR_T_LD) {
                    uVar44 = (uint)pgVar40;
                    if ((0x20 < (uVar44 & 0x3e)) || ((0x101000410U >> (uVar44 & 0x3e) & 1) == 0)) {
                      prVar2 = gen_ctx->ra_ctx;
                      pVVar12 = prVar2->curr_gaps;
                      if ((pVVar12 == (VARR_lr_gap_t *)0x0) || (pVVar12->varr == (lr_gap_t *)0x0))
                      goto LAB_0016ee7f;
                      pVVar12->els_num = 0;
                      local_c0 = (gen_ctx_t)
                                 CONCAT44(local_c0._4_4_,
                                          (int)prVar2->curr_reg_infos[local_128._24_8_].freq);
                      local_c8 = (bitmap_t)
                                 ((long)pgVar40->call_used_hard_regs +
                                 (long)&local_68->data + (long)&local_60[-1]._fileno);
                      local_e8 = (gen_ctx_t)((ulong)local_e8 & 0xffffffff00000000);
                      bVar55 = true;
                      pgVar45 = local_b0;
                      do {
                        pgVar46 = (gen_ctx_t)((ulong)pgVar40 & 0xffffffff);
                        pcVar26 = &DAT_00000001;
                        iVar24 = available_hreg_p(uVar44,1,(int)local_128._16_8_,(bitmap_t *)pgVar45
                                                  ,(live_range_t_conflict)in_R8);
                        if (iVar24 == 0) {
                          pgVar46 = (gen_ctx_t)((ulong)pgVar40 & 0xffffffff);
                          pcVar26 = &DAT_00000001;
                          iVar24 = available_hreg_p(uVar44,1,(int)local_88,(bitmap_t *)pgVar45,
                                                    (live_range_t_conflict)in_R8);
                          if (iVar24 == 0) {
                            if ((gen_ctx *)pgVar45->ctx == (gen_ctx *)0x0) break;
                            pcVar26 = (char *)pgVar45;
                            iVar24 = gap_lr_spill_cost(gen_ctx,(live_range_t_conflict)pgVar45);
                            pVVar12 = gen_ctx->ra_ctx->curr_gaps;
                            pgVar46 = (gen_ctx_t)pVVar12->varr;
                            if (pgVar46 == (gen_ctx_t)0x0) goto LAB_0016ee33;
                            uVar27 = pVVar12->els_num + 1;
                            if (pVVar12->size < uVar27) {
                              sVar54 = (uVar27 >> 1) + uVar27;
                              pcVar26 = (char *)(sVar54 * 0x10);
                              plVar36 = (lr_gap_t *)realloc(pgVar46,(size_t)pcVar26);
                              pVVar12->varr = plVar36;
                              pVVar12->size = sVar54;
                            }
                            local_c0 = (gen_ctx_t)CONCAT44(local_c0._4_4_,(int)local_c0 - iVar24);
                            sVar54 = pVVar12->els_num;
                            plVar36 = pVVar12->varr;
                            pVVar12->els_num = sVar54 + 1;
                            *(bitmap_t *)(plVar36 + sVar54) = local_c8;
                            plVar36[sVar54].lr = (live_range_t_conflict)pgVar45;
                          }
                          else {
                            pVVar12 = gen_ctx->ra_ctx->curr_gaps;
                            if (pVVar12 == (VARR_lr_gap_t *)0x0) goto LAB_0016ee06;
                            if (pVVar12->els_num == 0) {
                              local_f0 = (gen_ctx_t)0x0;
                            }
                            else {
                              if (pVVar12->varr == (lr_gap_t *)0x0) goto LAB_0016ee2e;
                              local_f0 = (gen_ctx_t)pVVar12->varr[pVVar12->els_num - 1].lr;
                            }
                            bVar55 = -1 < (long)(int)pgVar45->optimize_level;
                            if (bVar55) {
                              bVar55 = true;
                              uVar27 = (long)(int)pgVar45->optimize_level;
                              do {
                                pVVar37 = gen_ctx->ra_ctx->lr_gap_bitmaps[(long)pgVar40];
                                if (((pVVar37 != (bitmap_t)0x0) && (uVar27 < pVVar37->els_num << 6))
                                   && ((pVVar37->varr[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) {
                                  local_48 = (uint)uVar27;
                                  pgVar46 = (gen_ctx_t)gen_ctx->ra_ctx->lr_gap_tab;
                                  in_R8 = (gen_ctx_t)local_78;
                                  el.lr = (live_range_t_conflict)&stack0xffffffffffffffb0;
                                  el._0_8_ = pgVar40;
                                  pcVar26 = (char *)pgVar40;
                                  iVar24 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar46,el,HTAB_FIND,
                                                            (lr_gap_t *)in_R8);
                                  if (iVar24 != 0) break;
                                }
                                bVar55 = 0 < (long)uVar27;
                                bVar16 = 0 < (long)uVar27;
                                uVar27 = uVar27 - 1;
                              } while (bVar16);
                            }
                            uVar21 = local_78._8_8_;
                            uVar19 = local_78._0_8_;
                            uVar43 = pgVar45->optimize_level;
                            pgVar51 = local_f0;
                            local_128._40_8_ = pVVar12;
                            if (bVar55) {
                              uVar53 = *(uint *)(local_78._8_8_ + 0xc);
                              iVar24 = 0;
                              in_R8 = (gen_ctx_t)local_78._8_8_;
                              if (((int)uVar43 <= (int)uVar53) &&
                                 (pgVar46 = local_f0, uVar43 = uVar53,
                                 local_f0 != (gen_ctx_t)local_78._8_8_)) {
                                pgVar46 = (gen_ctx_t)pVVar12->varr;
                                if (pgVar46 == (gen_ctx_t)0x0) goto LAB_0016eea7;
                                uVar27 = pVVar12->els_num + 1;
                                if (pVVar12->size < uVar27) {
                                  sVar54 = (uVar27 >> 1) + uVar27;
                                  plVar36 = (lr_gap_t *)realloc(pgVar46,sVar54 * 0x10);
                                  *(lr_gap_t **)(local_128._40_8_ + 0x10) = plVar36;
                                  *(size_t *)(local_128._40_8_ + 8) = sVar54;
                                }
                                uVar20 = local_78._0_8_;
                                sVar54 = *(size_t *)local_128._40_8_;
                                plVar13 = *(lr_gap_t **)(local_128._40_8_ + 0x10);
                                *(size_t *)local_128._40_8_ = sVar54 + 1;
                                plVar36 = plVar13 + sVar54;
                                local_78._0_2_ = (undefined2)uVar19;
                                local_78._2_2_ = SUB82(uVar19,2);
                                local_78._4_4_ = SUB84(uVar19,4);
                                plVar36->hreg = local_78._0_2_;
                                plVar36->type = local_78._2_2_;
                                plVar36->reg = local_78._4_4_;
                                plVar13[sVar54].lr = (live_range_t_conflict)uVar21;
                                pcVar26 = (char *)uVar21;
                                pgVar46 = gen_ctx;
                                in_R8 = (gen_ctx_t)uVar21;
                                local_78._0_8_ = uVar20;
                                iVar24 = gap_lr_spill_cost(gen_ctx,(live_range_t_conflict)uVar21);
                                pgVar51 = (gen_ctx_t)uVar21;
                              }
                            }
                            else {
                              iVar24 = 0;
                            }
                            while ((int)uVar43 < *(int *)&pgVar45->field_0xc) {
                              uVar43 = uVar43 + 1;
                              pVVar37 = gen_ctx->ra_ctx->lr_gap_bitmaps[(long)pgVar40];
                              if (pVVar37 != (bitmap_t)0x0) {
                                pgVar41 = (gen_ctx_t)(long)(int)uVar43;
                                pcVar26 = (char *)(pVVar37->els_num << 6);
                                if ((pgVar41 < pcVar26) &&
                                   (pcVar26 = (char *)((ulong)pgVar41 >> 6),
                                   (pVVar37->varr[(long)pcVar26] >> ((ulong)pgVar41 & 0x3f) & 1) !=
                                   0)) {
                                  pgVar46 = (gen_ctx_t)gen_ctx->ra_ctx->lr_gap_tab;
                                  in_R8 = (gen_ctx_t)local_78;
                                  el_00.lr = (live_range_t_conflict)&stack0xffffffffffffffb0;
                                  el_00._0_8_ = pgVar40;
                                  pcVar26 = (char *)pgVar40;
                                  local_48 = uVar43;
                                  iVar25 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar46,el_00,HTAB_FIND
                                                            ,(lr_gap_t *)in_R8);
                                  uVar21 = local_78._8_8_;
                                  uVar19 = local_128._40_8_;
                                  if (iVar25 != 0) {
                                    if (pgVar51 != (gen_ctx_t)local_78._8_8_) {
                                      if (*(lr_gap_t **)(local_128._40_8_ + 0x10) == (lr_gap_t *)0x0
                                         ) goto LAB_0016ede8;
                                      uVar27 = *(size_t *)local_128._40_8_ + 1;
                                      pgVar46 = (gen_ctx_t)local_78._0_8_;
                                      if (*(size_t *)(local_128._40_8_ + 8) < uVar27) {
                                        sVar54 = (uVar27 >> 1) + uVar27;
                                        local_f0 = (gen_ctx_t)local_78._0_8_;
                                        plVar36 = (lr_gap_t *)
                                                  realloc(*(lr_gap_t **)(local_128._40_8_ + 0x10),
                                                          sVar54 * 0x10);
                                        *(lr_gap_t **)(uVar19 + 0x10) = plVar36;
                                        *(size_t *)(uVar19 + 8) = sVar54;
                                        pgVar46 = local_f0;
                                      }
                                      sVar54 = *(size_t *)uVar19;
                                      plVar36 = *(lr_gap_t **)(uVar19 + 0x10);
                                      *(size_t *)uVar19 = sVar54 + 1;
                                      *(gen_ctx_t *)(plVar36 + sVar54) = pgVar46;
                                      plVar36[sVar54].lr = (live_range_t_conflict)uVar21;
                                      pcVar26 = (char *)uVar21;
                                      pgVar46 = gen_ctx;
                                      iVar25 = gap_lr_spill_cost(gen_ctx,(live_range_t_conflict)
                                                                         uVar21);
                                      iVar24 = iVar24 + iVar25;
                                      pgVar51 = (gen_ctx_t)uVar21;
                                    }
                                    uVar43 = *(uint *)(uVar21 + 0xc);
                                  }
                                }
                              }
                            }
                            local_c0 = (gen_ctx_t)CONCAT44(local_c0._4_4_,(int)local_c0 - iVar24);
                            local_e8 = (gen_ctx_t)
                                       CONCAT44(local_e8._4_4_,
                                                (((int)local_e8 + *(int *)&pgVar45->field_0xc) -
                                                pgVar45->optimize_level) + 1);
                          }
                        }
                        pgVar45 = (gen_ctx_t)pgVar45->debug_file;
                        bVar55 = pgVar45 != (gen_ctx_t)0x0;
                      } while (bVar55);
                      pgVar45 = local_98;
                      reg = local_b4;
                      cVar47 = local_128[0xf];
                      if (!bVar55) {
                        pgVar46 = (gen_ctx_t)((ulong)local_c0 & 0xffffffff);
                        if (-1 < (int)local_c0) {
                          pVVar37 = gen_ctx->call_used_hard_regs[0x12];
                          if (pVVar37 == (bitmap_t)0x0) goto LAB_0016eec0;
                          uVar43 = 0;
                          if (pgVar40 < (gen_ctx_t)(pVVar37->els_num << 6)) {
                            uVar43 = (uint)(*pVVar37->varr >> ((ulong)pgVar40 & 0x3f)) & 1;
                          }
                          if ((((local_128._4_4_ == 0xffffffff) || (local_dc < (int)local_c0)) ||
                              (((int)local_c0 == local_dc && ((local_e0 != 0 && (uVar43 != 0))))))
                             || (((int)local_c0 == local_dc &&
                                 ((local_e0 == (uVar43 == 0) && (local_b8 < (int)local_e8)))))) {
                            local_e0 = uVar43 ^ 1;
                            prVar2 = gen_ctx->ra_ctx;
                            pVVar12 = prVar2->spill_gaps;
                            pcVar26 = (char *)prVar2->curr_gaps;
                            prVar2->spill_gaps = (VARR_lr_gap_t *)pcVar26;
                            prVar2->curr_gaps = pVVar12;
                            local_b8 = (int)local_e8;
                            local_128._4_4_ = uVar44;
                            local_dc = (int)local_c0;
                          }
                        }
                      }
                    }
                  }
                  pgVar40 = (gen_ctx_t)((long)&pgVar40->ctx + 1);
                } while (pgVar40 != (gen_ctx_t)0x22);
                if (local_128._4_4_ == 0xffffffff) goto LAB_0016e5f0;
                setup_used_hard_regs(gen_ctx,local_128._8_4_,local_128._4_4_);
                pcVar26 = "(with splitting live ranges)";
              }
              else {
                setup_used_hard_regs(gen_ctx,local_128._8_4_,local_128._4_4_);
LAB_0016e611:
                pcVar26 = "";
              }
              pFVar14 = (FILE *)gen_ctx->debug_file;
              if ((pFVar14 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                pcVar29 = MIR_reg_name(gen_ctx->ctx,reg,local_d8);
                in_stack_fffffffffffffec8 = (ulong)(uint)local_128._4_4_;
                in_R8 = local_d0;
                fprintf(pFVar14," Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar26,pcVar29,
                        local_d0,gen_ctx->ra_ctx->curr_reg_infos[local_128._24_8_].freq,
                        in_stack_fffffffffffffec8);
                fwrite("  live range: ",0xe,1,(FILE *)gen_ctx->debug_file);
                print_live_ranges(gen_ctx,(live_range_t_conflict)local_b0);
              }
              if ((local_90 == (bitmap_t)0x0) || (local_90->varr == (bitmap_el_t *)0x0))
              goto LAB_0016ee38;
              local_90->els_num = 0;
              local_128._16_8_ = ZEXT48((uint)local_128._0_4_);
              while( true ) {
                pVVar12 = gen_ctx->ra_ctx->spill_gaps;
                if (pVVar12 == (VARR_lr_gap_t *)0x0) goto LAB_0016ed75;
                if (pVVar12->els_num == 0) break;
                plVar36 = pVVar12->varr;
                if (plVar36 == (lr_gap_t *)0x0) goto LAB_0016ed84;
                sVar54 = pVVar12->els_num - 1;
                pVVar12->els_num = sVar54;
                pVVar12 = *(VARR_lr_gap_t **)(plVar36 + sVar54);
                plVar35 = plVar36[sVar54].lr;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (3 < gen_ctx->debug_level)) {
                  pcVar26 = "";
                  if ((int)((ulong)pVVar12 >> 0x20) == (int)local_d0) {
                    pcVar26 = "*";
                  }
                  in_R8 = (gen_ctx_t)(ulong)(uint)(int)(short)pVVar12;
                  in_stack_fffffffffffffec8 =
                       CONCAT44((int)(in_stack_fffffffffffffec8 >> 0x20),plVar35->finish);
                  fprintf((FILE *)gen_ctx->debug_file,"   Splitting lr gap: r%d%s, h%d [%d..%d]\n",
                          (ulong)pVVar12 >> 0x20,pcVar26,in_R8,(ulong)(uint)plVar35->start,
                          in_stack_fffffffffffffec8);
                }
                plVar49 = plVar35->lr_bb;
                local_128._40_8_ = pVVar12;
                if (plVar49 != (lr_bb_t_conflict)0x0) {
                  do {
                    pVVar37 = plVar49->bb->gen;
                    bitmap_expand(pVVar37,((ulong)pVVar12 >> 0x20) + 1);
                    if (pVVar37 == (bitmap_t)0x0) {
LAB_0016ed24:
                      assign_cold_41();
LAB_0016ed33:
                      __assert_fail("lr->lr_bb != ((void*)0)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c49,
                                    "void insert_lr_gap(gen_ctx_t, int, MIR_type_t, MIR_reg_t, live_range_t)"
                                   );
                    }
                    pVVar37->varr[(ulong)pVVar12 >> 0x26] =
                         pVVar37->varr[(ulong)pVVar12 >> 0x26] |
                         1L << ((ulong)pVVar12 >> 0x20 & 0x3f);
                    plVar49 = plVar49->next;
                  } while (plVar49 != (lr_bb_t)0x0);
                }
                pVVar37 = local_90;
                if (SUB84(local_128._40_8_,4) == (int)local_d0) {
                  uVar27 = (ulong)plVar35->start;
                  bitmap_expand(local_90,uVar27 + 1);
                  pVVar37->varr[uVar27 >> 6] = pVVar37->varr[uVar27 >> 6] | 1L << (uVar27 & 0x3f);
                }
                else {
                  sVar38 = (short)local_128._40_8_;
                  local_128._16_8_ =
                       ZEXT48((((uint)local_128._40_8_ & 0xffff0000) == 0xa0000 &&
                              0x21 < (uint)(int)sVar38) + 1);
                  pMVar42 = (MIR_item_t)0x0;
                  do {
                    if (plVar35->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_0016ecf7:
                      local_128._0_4_ = (undefined4)local_128._16_8_;
                      __assert_fail("lr->lr_bb != ((void*)0) && gen_ctx->ra_ctx->lr_gap_bitmaps[hreg] != ((void*)0)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c51,"void delete_lr_gap(gen_ctx_t, int, live_range_t)");
                    }
                    uVar44 = (int)sVar38 + (int)pMVar42;
                    prVar2 = gen_ctx->ra_ctx;
                    pVVar37 = prVar2->lr_gap_bitmaps[(int)uVar44];
                    if (pVVar37 == (bitmap_t)0x0) goto LAB_0016ecf7;
                    iVar24 = plVar35->start;
                    if ((ulong)(long)iVar24 < pVVar37->els_num << 6) {
                      bVar17 = (byte)iVar24 & 0x3f;
                      pVVar37->varr[(ulong)(long)iVar24 >> 6] =
                           pVVar37->varr[(ulong)(long)iVar24 >> 6] &
                           (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
                    }
                    el_01._0_4_ = uVar44 & 0xffff;
                    el_01.reg = 0;
                    el_01.lr = plVar35;
                    HTAB_lr_gap_t_do(prVar2->lr_gap_tab,el_01,HTAB_DELETE,
                                     (lr_gap_t *)&stack0xffffffffffffffb0);
                    iVar24 = plVar35->start;
                    iVar25 = plVar35->finish;
                    in_R8 = (gen_ctx_t)(long)iVar24;
                    if (iVar24 <= iVar25) {
                      bVar17 = (byte)uVar44 & 0x3f;
                      in_R8 = (gen_ctx_t)0x0;
                      do {
                        pMVar15 = ((MIR_item_t_conflict *)(local_128._48_8_ + 0x68))
                                  [(long)((long)((gen_ctx_t)(long)iVar24)->call_used_hard_regs +
                                         (long)((long)&in_R8[-1].temp_insns2 + 3))];
                        if (pMVar15 == (MIR_item_t_conflict)0x0) goto LAB_0016ecba;
                        if ((ulong)uVar44 < (ulong)((long)pMVar15->data << 6)) {
                          ppvVar1 = &((pMVar15->item_link).prev)->data + (uVar44 >> 6);
                          *ppvVar1 = (void *)((ulong)*ppvVar1 &
                                             (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17))
                          ;
                        }
                        in_R8 = (gen_ctx_t)((long)&in_R8->ctx + 1);
                      } while ((iVar25 - iVar24) + 1 != (int)in_R8);
                    }
                    pMVar42 = (MIR_item_t)((long)&pMVar42->data + 1);
                  } while (pMVar42 != (MIR_item_t)local_128._16_8_);
                }
              }
              local_128._0_4_ = (undefined4)local_128._16_8_;
              pVVar4 = gen_ctx->ra_ctx->reg_renumber;
              if (((pVVar4 == (VARR_MIR_reg_t *)0x0) || (pVVar4->varr == (MIR_reg_t *)0x0)) ||
                 ((FILE *)pVVar4->els_num <= (ulong)local_128._24_8_)) goto LAB_0016ee1a;
              local_c8 = (bitmap_t)CONCAT71(local_c8._1_7_,(uint)local_128._36_4_ < 2);
              pVVar4->varr[local_128._24_8_] = local_128._4_4_;
              local_128._0_4_ = (local_128._8_4_ == MIR_T_LD && 0x21 < (uint)local_128._4_4_) + 1;
              pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
              if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                  (pVVar11->varr == (live_range_t_conflict *)0x0)) ||
                 ((FILE *)pVVar11->els_num <= (ulong)local_128._24_8_)) goto LAB_0016ee15;
              pMVar42 = (MIR_item_t)pVVar11->varr[local_128._24_8_];
              if (pMVar42 != (MIR_item_t)0x0) {
                local_c8 = (bitmap_t)
                           CONCAT71(local_c8._1_7_,
                                    (uint)local_128._36_4_ < 2 || 0x21 < (uint)local_128._4_4_);
                local_128._24_8_ = local_128._24_8_ << 0x20;
                local_128._8_4_ = local_128._8_4_ << 0x10;
                local_88 = (bitmap_t)(ulong)(uint)local_128._4_4_;
                local_e8 = (gen_ctx_t)(ulong)(uint)local_128._0_4_;
                local_b0 = (gen_ctx_t)((long)local_88 << 0x20);
                do {
                  uVar19 = local_128._48_8_;
                  uVar44 = 1;
                  local_128._16_8_ = pMVar42;
                  if ((char)local_c8 == '\0') {
                    uVar27 = (ulong)*(int *)&pMVar42->module;
                    uVar43 = 0;
                    if (uVar27 < local_90->els_num << 6) {
                      uVar43 = (uint)(local_90->varr[uVar27 >> 6] >> (uVar27 & 0x3f)) & 1;
                    }
                    uVar44 = uVar43 ^ 1;
                    if (uVar43 == 0) goto LAB_0016ea1d;
                  }
                  else {
LAB_0016ea1d:
                    lVar50 = (long)*(int *)&pMVar42->module;
                    pgVar46 = local_e8;
                    uVar43 = local_128._4_4_;
                    if (*(int *)&pMVar42->module <= *(int *)((long)&pMVar42->module + 4)) {
                      do {
                        pMVar15 = ((MIR_item_t_conflict *)(uVar19 + 0x68))[lVar50 + -0xd];
                        bitmap_expand((bitmap_t)pMVar15,(ulong)uVar43 + 1);
                        if (pMVar15 == (MIR_item_t_conflict)0x0) {
                          assign_cold_44();
LAB_0016ecba:
                          assign_cold_42();
LAB_0016ecc9:
                          assign_cold_26();
LAB_0016ecce:
                          assign_cold_25();
                          goto LAB_0016ecd3;
                        }
                        ppvVar1 = &((pMVar15->item_link).prev)->data + (uVar43 >> 6);
                        *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)uVar43 & 0x3f));
                        pgVar46 = (gen_ctx_t)((long)&pgVar46[-1].spot_attrs + 7);
                        uVar43 = uVar43 + 1;
                      } while ((pgVar46 != (gen_ctx_t)0x0) ||
                              (bVar55 = lVar50 < *(int *)((long)(local_128._16_8_ + 8) + 4),
                              pgVar46 = local_e8, uVar43 = local_128._4_4_, lVar50 = lVar50 + 1,
                              bVar55));
                    }
                  }
                  pMVar42 = (MIR_item_t)local_128._16_8_;
                  if ((char)local_c8 == '\0') {
                    if ((bitmap_t)*(lr_bb_t_conflict *)local_128._16_8_ == (bitmap_t)0x0) {
                      pgVar46 = local_e8;
                      pVVar37 = local_88;
                      lVar50 = (long)*(int *)(local_128._16_8_ + 8);
                      if (*(int *)(local_128._16_8_ + 8) <=
                          *(int *)((long)(local_128._16_8_ + 8) + 4)) {
                        do {
                          bm = (bitmap_t)(&local_a0->els_num)[lVar50];
                          nb = (bitmap_t)((long)&pVVar37->els_num + 1);
                          bitmap_expand(bm,(size_t)nb);
                          if (bm == (bitmap_t)0x0) {
LAB_0016ecd3:
                            assign_cold_46();
LAB_0016ecd8:
                            __assert_fail("bitmap_bit_p (used_locs_addr[j], hard_reg)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1db1,"void assign(gen_ctx_t)");
                          }
                          bm->varr[(ulong)pVVar37 >> 6] =
                               bm->varr[(ulong)pVVar37 >> 6] | 1L << ((ulong)pVVar37 & 0x3f);
                          pgVar46 = (gen_ctx_t)((long)&pgVar46[-1].spot_attrs + 7);
                          pVVar37 = nb;
                        } while ((pgVar46 != (gen_ctx_t)0x0) ||
                                (bVar55 = lVar50 < *(int *)((long)(local_128._16_8_ + 8) + 4),
                                pMVar42 = (MIR_item_t)local_128._16_8_, pgVar46 = local_e8,
                                pVVar37 = local_88, lVar50 = lVar50 + 1, bVar55));
                      }
                    }
                    else if (uVar44 != 0) {
                      local_128._40_4_ = local_128._4_4_;
                      pgVar46 = local_e8;
                      pgVar45 = local_b0;
                      do {
                        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                           (3 < gen_ctx->debug_level)) {
                          fprintf((FILE *)gen_ctx->debug_file,
                                  "    Adding lr gap: r%d, h%d [%d..%d]\n",local_d0,
                                  local_128._40_8_ & 0xffffffff,(ulong)*(uint *)&pMVar42->module,
                                  (ulong)(uint)*(int *)((long)&pMVar42->module + 4));
                        }
                        if ((bitmap_t)pMVar42->data == (bitmap_t)0x0) goto LAB_0016ed33;
                        prVar2 = gen_ctx->ra_ctx;
                        local_f0 = pgVar46;
                        local_c0 = pgVar45;
                        if (*(long *)((long)prVar2->lr_gap_bitmaps + ((long)pgVar45 >> 0x1d)) == 0)
                        {
                          uVar44 = (*(int *)(local_128._16_8_ + 8) * 3) / 2 + 0x3f;
                          sVar54 = (ulong)(long)(int)uVar44 >> 6;
                          pVVar37 = (bitmap_t)malloc(0x18);
                          if (uVar44 < 0x40) {
                            sVar54 = 0x40;
                          }
                          pVVar37->els_num = 0;
                          pVVar37->size = sVar54;
                          pbVar32 = (bitmap_el_t *)malloc(sVar54 << 3);
                          pVVar37->varr = pbVar32;
                          prVar2->lr_gap_bitmaps[(long)pgVar45 >> 0x20] = pVVar37;
                        }
                        pMVar42 = (MIR_item_t)local_128._16_8_;
                        pVVar37 = gen_ctx->ra_ctx->lr_gap_bitmaps[(long)pgVar45 >> 0x20];
                        uVar27 = (ulong)*(int *)(local_128._16_8_ + 8);
                        bitmap_expand(pVVar37,uVar27 + 1);
                        pgVar46 = local_f0;
                        if (pVVar37 == (bitmap_t)0x0) {
                          assign_cold_45();
                          goto LAB_0016ed57;
                        }
                        uVar18 = local_128._40_4_;
                        el_02._0_8_ = (ulong)(local_128._40_4_ & 0xffff | local_128._8_4_) |
                                      local_128._24_8_;
                        pVVar37->varr[uVar27 >> 6] =
                             pVVar37->varr[uVar27 >> 6] | 1L << (uVar27 & 0x3f);
                        in_R8 = (gen_ctx_t)&stack0xffffffffffffffb0;
                        el_02.lr = (live_range_t_conflict)pMVar42;
                        HTAB_lr_gap_t_do(gen_ctx->ra_ctx->lr_gap_tab,el_02,HTAB_INSERT,
                                         (lr_gap_t *)in_R8);
                        pgVar45 = local_c0 + 0x800000;
                        local_128._40_4_ = uVar18 + MIR_T_U8;
                        pgVar46 = (gen_ctx_t)((long)&pgVar46[-1].spot_attrs + 7);
                      } while (pgVar46 != (gen_ctx_t)0x0);
                    }
                  }
                  pMVar42 = (pMVar42->item_link).next;
                } while (pMVar42 != (MIR_item_t)0x0);
              }
            }
          }
          else {
            pcVar26 = MIR_reg_hard_reg_name((MIR_context_t)local_58,reg,local_d8);
            uVar44 = _MIR_get_hard_reg((MIR_context_t)pgVar40,pcVar26);
            if (0x21 < uVar44) goto LAB_0016ee56;
            pVVar4 = gen_ctx->ra_ctx->reg_renumber;
            if (((pVVar4 == (VARR_MIR_reg_t *)0x0) || (pVVar4->varr == (MIR_reg_t *)0x0)) ||
               ((FILE *)pVVar4->els_num <= (ulong)local_128._24_8_)) goto LAB_0016edf7;
            pVVar4->varr[local_128._24_8_] = uVar44;
            pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) ||
               ((FILE *)pVVar11->els_num <= (ulong)local_128._24_8_)) goto LAB_0016eded;
            plVar35 = pVVar11->varr[local_128._24_8_];
            if (plVar35 != (live_range_t_conflict)0x0) {
              do {
                iVar24 = plVar35->start;
                in_R8 = (gen_ctx_t)(long)iVar24;
                if (iVar24 <= plVar35->finish) {
                  in_R8 = (gen_ctx_t)0x0;
                  do {
                    pMVar15 = ((MIR_item_t_conflict *)(local_128._48_8_ + 0x68))
                              [(long)((long)((gen_ctx_t)(long)iVar24)->call_used_hard_regs +
                                     (long)((long)&in_R8[-1].temp_insns2 + 3))];
                    if (pMVar15 == (MIR_item_t_conflict)0x0) {
                      assign_cold_27();
                      goto LAB_0016ed24;
                    }
                    if (((ulong)((long)pMVar15->data << 6) <= (ulong)uVar44) ||
                       (((ulong)((pMVar15->item_link).prev)->data & 1L << ((ulong)uVar44 & 0x3f)) ==
                        0)) goto LAB_0016ecd8;
                    in_R8 = (gen_ctx_t)((long)&in_R8->ctx + 1);
                  } while ((plVar35->finish - iVar24) + 1 != (int)in_R8);
                }
                plVar35 = plVar35->next;
              } while (plVar35 != (live_range_t)0x0);
            }
            if (pcVar26 == (char *)0x0) {
              setup_used_hard_regs(gen_ctx,local_128._8_4_,uVar44);
            }
            pFVar14 = (FILE *)gen_ctx->debug_file;
            if ((pFVar14 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              pcVar26 = MIR_reg_name(gen_ctx->ctx,reg,local_d8);
              in_R8 = (gen_ctx_t)gen_ctx->ra_ctx->curr_reg_infos[local_128._24_8_].freq;
              fprintf(pFVar14," Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar26,
                      local_d0,in_R8,(ulong)uVar44);
            }
          }
        }
        pVVar37 = (bitmap_t)((long)&local_80->els_num + 1);
      } while (pVVar37 != local_a8);
    }
    return;
  }
LAB_0016ee8e:
  assign_cold_57();
LAB_0016ee93:
  assign_cold_22();
LAB_0016ee98:
  assign_cold_31();
LAB_0016ee9d:
  assign_cold_8();
LAB_0016eea2:
  assign_cold_30();
LAB_0016eea7:
  assign_cold_33();
LAB_0016eeac:
  assign_cold_66();
LAB_0016eeb1:
  assign_cold_61();
LAB_0016eeb6:
  assign_cold_60();
LAB_0016eebb:
  assign_cold_59();
LAB_0016eec0:
  assign_cold_37();
LAB_0016eec5:
  assign_cold_40();
LAB_0016eeca:
  assign_cold_39();
  output_bitmap(pgVar46,"  live_in:",(bitmap_t)((gen_ctx_t)pcVar26)->call_used_hard_regs[0],1,
                (MIR_reg_t *)0x0);
  output_bitmap(pgVar46,"  live_out:",((gen_ctx_t)pcVar26)->call_used_hard_regs[1],1,
                (MIR_reg_t *)0x0);
  output_bitmap(pgVar46,"  spill_gen:",((gen_ctx_t)pcVar26)->call_used_hard_regs[2],1,
                (MIR_reg_t *)0x0);
  output_bitmap(pgVar46,"  spill_kill:",((gen_ctx_t)pcVar26)->call_used_hard_regs[3],1,
                (MIR_reg_t *)0x0);
  return;
}

Assistant:

static void assign (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t best_loc, i, reg, var, max_var = get_max_var (gen_ctx);
  MIR_type_t type;
  int slots_num;
  int j, k, simple_loc_update_p, reserve_p, nregs;
  live_range_t start_lr, lr;
  bitmap_t bm;
  size_t length;
  bitmap_t *used_locs_addr, *busy_used_locs_addr;
  allocno_info_t allocno_info;
  MIR_func_t func = curr_func_item->u.func;
  bitmap_t global_hard_regs = _MIR_get_module_global_var_hard_regs (ctx, curr_func_item->module);
  const char *msg;
  const int simplified_p = ONLY_SIMPLIFIED_RA || optimize_level < 2;
  bitmap_t conflict_locs = conflict_locs1, spill_lr_starts = temp_bitmap2;

  func_stack_slots_num = 0;
  curr_reg_infos = VARR_ADDR (reg_info_t, curr_cfg->reg_info);
  VARR_TRUNC (MIR_reg_t, reg_renumber, 0);
  for (i = 0; i <= max_var; i++) {
    VARR_PUSH (MIR_reg_t, reg_renumber, MIR_NON_VAR);
  }
  /* max_var for func */
  VARR_TRUNC (allocno_info_t, sorted_regs, 0);
  allocno_info.reg_infos = curr_reg_infos;
  start_mem_loc = MAX_HARD_REG + 1;
  for (reg = MAX_HARD_REG + 1; reg <= max_var; reg++) {
    allocno_info.reg = reg;
    allocno_info.tied_reg_p = bitmap_bit_p (tied_regs, reg);
    if (bitmap_bit_p (addr_regs, reg)) {
      type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, func);
      best_loc = get_new_stack_slot (gen_ctx, type, &slots_num);
      VARR_SET (MIR_reg_t, reg_renumber, reg, best_loc);
      start_mem_loc = best_loc + slots_num;
      DEBUG (2, {
        fprintf (debug_file, " Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",
                 MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg,
                 curr_reg_infos[reg].freq, (unsigned long) best_loc);
      });
      continue;
    }
    VARR_PUSH (allocno_info_t, sorted_regs, allocno_info);
    for (length = 0, lr = VARR_GET (live_range_t, var_live_ranges, reg); lr != NULL; lr = lr->next)
      length += lr->finish - lr->start + 1;
    curr_reg_infos[reg].live_length = length;
  }
  for (int n = 0; n <= curr_point && n < (int) VARR_LENGTH (bitmap_t, used_locs); n++)
    if (global_hard_regs == NULL) {
      bitmap_clear (VARR_GET (bitmap_t, used_locs, n));
      if (!simplified_p) bitmap_clear (VARR_GET (bitmap_t, busy_used_locs, n));
    } else {
      bitmap_copy (VARR_GET (bitmap_t, used_locs, n), global_hard_regs);
      if (!simplified_p) bitmap_copy (VARR_GET (bitmap_t, busy_used_locs, n), global_hard_regs);
    }
  while ((int) VARR_LENGTH (bitmap_t, used_locs) <= curr_point) {
    bm = bitmap_create2 (MAX_HARD_REG + 1);
    if (global_hard_regs != NULL) bitmap_copy (bm, global_hard_regs);
    VARR_PUSH (bitmap_t, used_locs, bm);
    if (!simplified_p) {
      bm = bitmap_create2 (MAX_HARD_REG + 1);
      if (global_hard_regs != NULL) bitmap_copy (bm, global_hard_regs);
      VARR_PUSH (bitmap_t, busy_used_locs, bm);
    }
  }
  nregs = (int) VARR_LENGTH (allocno_info_t, sorted_regs);
  qsort (VARR_ADDR (allocno_info_t, sorted_regs), nregs, sizeof (allocno_info_t),
         allocno_info_compare_func);
  used_locs_addr = VARR_ADDR (bitmap_t, used_locs);
  busy_used_locs_addr = VARR_ADDR (bitmap_t, busy_used_locs);
  /* Mark ranges used by hard regs for pseudo reg splitting: */
  for (i = 0; i <= MAX_HARD_REG; i++) {
    for (lr = VARR_GET (live_range_t, var_live_ranges, i); lr != NULL; lr = lr->next)
      for (j = lr->start; j <= lr->finish; j++) {
        bitmap_set_bit_p (used_locs_addr[j], i);
        if (!simplified_p) bitmap_set_bit_p (busy_used_locs_addr[j], i);
      }
  }
  bitmap_clear (func_used_hard_regs);
  if (!simplified_p) HTAB_CLEAR (lr_gap_t, lr_gap_tab);
  for (int n = 0; n < nregs; n++) { /* hard reg and stack slot assignment */
    reg = VARR_GET (allocno_info_t, sorted_regs, n).reg;
    if (VARR_GET (MIR_reg_t, reg_renumber, reg) != MIR_NON_VAR) continue;
    type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, func);
    if (VARR_GET (allocno_info_t, sorted_regs, n).tied_reg_p) {
      const char *hard_reg_name = MIR_reg_hard_reg_name (ctx, reg - MAX_HARD_REG, func);
      int hard_reg = _MIR_get_hard_reg (ctx, hard_reg_name);
      gen_assert (hard_reg >= 0 && hard_reg <= MAX_HARD_REG
                  && target_locs_num (hard_reg, type) == 1);
      VARR_SET (MIR_reg_t, reg_renumber, reg, hard_reg);
#ifndef NDEBUG
      for (lr = VARR_GET (live_range_t, var_live_ranges, reg); lr != NULL; lr = lr->next)
        for (j = lr->start; j <= lr->finish; j++)
          gen_assert (bitmap_bit_p (used_locs_addr[j], hard_reg));
#endif
      if (hard_reg_name == NULL) setup_used_hard_regs (gen_ctx, type, hard_reg);
      DEBUG (2, {
        fprintf (debug_file, " Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",
                 MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg,
                 curr_reg_infos[reg].freq, (unsigned long) hard_reg);
      });
      continue;
    }
    var = reg;
    if ((start_lr = VARR_GET (live_range_t, var_live_ranges, var)) == NULL) continue;
    bitmap_clear (conflict_locs);
    for (lr = start_lr; lr != NULL; lr = lr->next) {
      for (j = lr->start; j <= lr->finish; j++)
        bitmap_ior (conflict_locs, conflict_locs, used_locs_addr[j]);
    }
    msg = "";
    VARR_TRUNC (lr_gap_t, spill_gaps, 0);
    if ((best_loc = get_hard_reg (gen_ctx, type, conflict_locs)) != MIR_NON_VAR) {
      setup_used_hard_regs (gen_ctx, type, best_loc);
    } else if (!simplified_p
               && ((best_loc = get_hard_reg_with_split (gen_ctx, reg, type, start_lr))
                   != MIR_NON_VAR)) {
      /* try to use gaps in already allocated pseudos or given pseudo: */
      setup_used_hard_regs (gen_ctx, type, best_loc);
      msg = "(with splitting live ranges)";
    } else {
      best_loc = get_stack_loc (gen_ctx, start_mem_loc, type, conflict_locs, &slots_num);
    }
    DEBUG (2, {
      fprintf (debug_file, " Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n", msg,
               MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg, curr_reg_infos[reg].freq,
               (unsigned long) best_loc);
      fprintf (debug_file, "  live range: ");
      print_live_ranges (gen_ctx, start_lr);
    });
    bitmap_clear (spill_lr_starts);
    while (VARR_LENGTH (lr_gap_t, spill_gaps) != 0) {
      lr_gap_t lr_gap = VARR_POP (lr_gap_t, spill_gaps);
      DEBUG (4, {
        fprintf (debug_file, "   Splitting lr gap: r%d%s, h%d [%d..%d]\n", lr_gap.reg,
                 lr_gap.reg == reg ? "*" : "", lr_gap.hreg, lr_gap.lr->start, lr_gap.lr->finish);
      });
      for (lr_bb_t lr_bb = lr_gap.lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next)
        bitmap_set_bit_p (lr_bb->bb->spill_gen, lr_gap.reg);
      if (lr_gap.reg == reg) {
        bitmap_set_bit_p (spill_lr_starts, lr_gap.lr->start);
        continue; /* spilled gap of the current reg */
      }
      slots_num = target_locs_num (lr_gap.hreg, lr_gap.type);
      for (k = 0; k < slots_num; k++) {
        MIR_reg_t curr_hr = target_nth_loc (lr_gap.hreg, lr_gap.type, k);
        delete_lr_gap (gen_ctx, curr_hr, lr_gap.lr);
        for (j = lr_gap.lr->start; j <= lr_gap.lr->finish; j++)
          bitmap_clear_bit_p (used_locs_addr[j], curr_hr);
      }
    }
    VARR_SET (MIR_reg_t, reg_renumber, reg, best_loc);
    slots_num = target_locs_num (best_loc, type);
    simple_loc_update_p = simplified_p || best_loc > MAX_HARD_REG;
    for (lr = VARR_GET (live_range_t, var_live_ranges, var); lr != NULL; lr = lr->next) {
      if ((reserve_p = simple_loc_update_p || !bitmap_bit_p (spill_lr_starts, lr->start))) {
        for (j = lr->start; j <= lr->finish; j++)
          for (k = 0; k < slots_num; k++)
            bitmap_set_bit_p (used_locs_addr[j], target_nth_loc (best_loc, type, k));
      }
      if (simple_loc_update_p) continue;
      if (lr->lr_bb == NULL) {
        for (j = lr->start; j <= lr->finish; j++)
          for (k = 0; k < slots_num; k++)
            bitmap_set_bit_p (busy_used_locs_addr[j], target_nth_loc (best_loc, type, k));
      } else if (reserve_p) {
        for (k = 0; k < slots_num; k++) {
          MIR_reg_t hr = target_nth_loc (best_loc, type, k);
          DEBUG (4, {
            fprintf (debug_file, "    Adding lr gap: r%d, h%d [%d..%d]\n", reg, hr, lr->start,
                     lr->finish);
          });
          insert_lr_gap (gen_ctx, hr, type, reg, lr);
        }
      }
    }
  }
}